

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O1

void print_version(void)

{
  char *pcVar1;
  int revision;
  int minor;
  int major;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  glfwGetVersion((int *)&local_1c,(int *)&local_20,(int *)&local_24);
  printf("GLFW header version: %u.%u.%u\n",3,2,1);
  printf("GLFW library version: %u.%u.%u\n",(ulong)local_1c,(ulong)local_20,(ulong)local_24);
  pcVar1 = glfwGetVersionString();
  printf("GLFW library version string: \"%s\"\n",pcVar1);
  return;
}

Assistant:

static void print_version(void)
{
    int major, minor, revision;
    glfwGetVersion(&major, &minor, &revision);

    printf("GLFW header version: %u.%u.%u\n",
           GLFW_VERSION_MAJOR,
           GLFW_VERSION_MINOR,
           GLFW_VERSION_REVISION);
    printf("GLFW library version: %u.%u.%u\n", major, minor, revision);
    printf("GLFW library version string: \"%s\"\n", glfwGetVersionString());
}